

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O3

int uv__platform_loop_init(uv_loop_t *loop)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = uv__epoll_create1(0x80000);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if ((*piVar2 == 0x26) || (*piVar2 == 0x16)) {
      iVar1 = uv__epoll_create(0x100);
      if (iVar1 != -1) {
        uv__cloexec_ioctl(iVar1,1);
        goto LAB_0054dc18;
      }
    }
    loop->backend_fd = -1;
    loop->inotify_fd = -1;
    loop->inotify_watchers = (void *)0x0;
    iVar1 = -*piVar2;
  }
  else {
LAB_0054dc18:
    loop->backend_fd = iVar1;
    loop->inotify_fd = -1;
    loop->inotify_watchers = (void *)0x0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int uv__platform_loop_init(uv_loop_t* loop) {
  int fd;

  fd = uv__epoll_create1(UV__EPOLL_CLOEXEC);

  /* epoll_create1() can fail either because it's not implemented (old kernel)
   * or because it doesn't understand the EPOLL_CLOEXEC flag.
   */
  if (fd == -1 && (errno == ENOSYS || errno == EINVAL)) {
    fd = uv__epoll_create(256);

    if (fd != -1)
      uv__cloexec(fd, 1);
  }

  loop->backend_fd = fd;
  loop->inotify_fd = -1;
  loop->inotify_watchers = NULL;

  if (fd == -1)
    return -errno;

  return 0;
}